

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-design.c
# Opt level: O0

void choose_artifact_theme(artifact *art)

{
  int iVar1;
  wchar_t wVar2;
  int16_t iVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  object_kind *poVar6;
  wchar_t local_3c;
  wchar_t old_weight;
  wchar_t power;
  wchar_t pick;
  wchar_t max_tries;
  object_kind *kind;
  artifact *art_local;
  
  poVar6 = lookup_kind(art->tval,art->sval);
  wVar2 = potential;
  if ((L'ᝰ' < potential) && (uVar4 = Rand_div(30000), uVar4 + L'\x01' < wVar2)) {
    for (power = L'\x03'; power != L'\0'; power = power + L'\xffffffff') {
      uVar4 = Rand_div(z_info->curse_max - 1);
      uVar5 = Rand_div(9);
      iVar3 = m_bonus(9,art->alloc_min);
      if ((curses[uVar4 + L'\x01'].poss[art->tval] & 1U) != 0) {
        append_artifact_curse(art,uVar4 + L'\x01',uVar5 + 1 + iVar3 * 10);
      }
    }
  }
  switch(poVar6->tval) {
  case 5:
    choose_launcher_theme(art);
    break;
  default:
    msg("error -- object kind not recognized.");
    break;
  case 7:
  case 8:
  case 9:
    choose_melee_weapon_theme(art);
    break;
  case 10:
    choose_boots_theme(art);
    break;
  case 0xb:
    choose_gloves_theme(art);
    break;
  case 0xc:
  case 0xd:
    choose_hat_theme(art);
    break;
  case 0xe:
    choose_shield_theme(art);
    break;
  case 0xf:
    choose_cloak_theme(art);
    break;
  case 0x10:
  case 0x11:
  case 0x12:
    choose_armor_theme(art);
  }
  uVar4 = Rand_div(6);
  if (uVar4 == 0) {
    iVar1 = art->weight;
    uVar4 = Rand_div(2);
    if ((uVar4 == 0) && (0x1d < art->weight)) {
      uVar4 = Rand_div(art->weight / 10);
      art->weight = (uVar4 + 1) * 5 + 5 + art->weight;
      potential = (art->weight - iVar1) * 10 + potential;
    }
    else if (0x31 < art->weight) {
      uVar4 = Rand_div(art->weight / 10);
      art->weight = art->weight - ((uVar4 + 1) * 5 + 5);
      local_3c = potential + (iVar1 - art->weight) * -10;
      if (local_3c < L'\0') {
        local_3c = L'\0';
      }
      potential = local_3c;
    }
  }
  return;
}

Assistant:

static void choose_artifact_theme(struct artifact *art)
{
	struct object_kind *kind = lookup_kind(art->tval, art->sval);

	/* Possibly make very powerful artifacts cursed. */
	if ((potential > 6000) && (potential > randint1(30000))) {
		int max_tries;
		for (max_tries = 3; max_tries; max_tries--) {
			int pick = randint1(z_info->curse_max - 1);
			int power = randint1(9) + 10 * m_bonus(9, art->alloc_min);
			if (!curses[pick].poss[art->tval]) continue;
			append_artifact_curse(art, pick, power);
		}
	}

	/* Frequently (but not always) assign a basic theme to the artifact. */
	switch (kind->tval) {
		case TV_SWORD:
		case TV_POLEARM:
		case TV_HAFTED: choose_melee_weapon_theme(art); break;
		case TV_BOW: choose_launcher_theme(art); break;
		case TV_SOFT_ARMOR:
		case TV_HARD_ARMOR:
		case TV_DRAG_ARMOR: choose_armor_theme(art); break;
		case TV_SHIELD: choose_shield_theme(art); break;
		case TV_BOOTS: choose_boots_theme(art); break;
		case TV_CLOAK: choose_cloak_theme(art); break;
		case TV_HELM:
		case TV_CROWN: choose_hat_theme(art); break;
		case TV_GLOVES: choose_gloves_theme(art); break;
		default: msg("error -- object kind not recognized."); break;
	}

	/* It is possible for artifacts to be unusually heavy or light. */
	if (one_in_(6)) {
		int old_weight = art->weight;
		if (one_in_(2) && (art->weight >= 30)) {
			/* Sometimes, they are unusually heavy. */
			art->weight += randint1(art->weight / 10) * 5 + 5;
			potential += (art->weight - old_weight) * 10;
		} else if (art->weight >= 50) {
			/* Sometimes, they are unusually light. */
			art->weight -= randint1(art->weight / 10) * 5 + 5;
			potential -= (old_weight - art->weight) * 10;
			potential = MAX(potential, 0);
		}
	}
}